

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdecode.cpp
# Opt level: O1

void libtorrent::detail::escape_string(string *ret,char *str,int len)

{
  ulong uVar1;
  char tmp [5];
  char local_35 [5];
  
  if (0 < len) {
    uVar1 = 0;
    do {
      if ((byte)(str[uVar1] + 0x81U) < 0xa1) {
        snprintf(local_35,5,"\\x%02x");
        std::__cxx11::string::append((char *)ret);
      }
      else {
        std::__cxx11::string::push_back((char)ret);
      }
      uVar1 = uVar1 + 1;
    } while ((uint)len != uVar1);
  }
  return;
}

Assistant:

void escape_string(std::string& ret, char const* str, int len)
	{
		for (int i = 0; i < len; ++i)
		{
			if (str[i] >= 32 && str[i] < 127)
			{
				ret += str[i];
			}
			else
			{
				char tmp[5];
				std::snprintf(tmp, sizeof(tmp), "\\x%02x", std::uint8_t(str[i]));
				ret += tmp;
			}
		}
	}